

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5DropAll(Fts5Config *pConfig)

{
  int local_14;
  int rc;
  Fts5Config *pConfig_local;
  
  local_14 = fts5ExecPrintf(pConfig->db,(char **)0x0,
                            "DROP TABLE IF EXISTS %Q.\'%q_data\';DROP TABLE IF EXISTS %Q.\'%q_idx\';DROP TABLE IF EXISTS %Q.\'%q_config\';"
                            ,pConfig->zDb,pConfig->zName,pConfig->zDb,pConfig->zName,pConfig->zDb,
                            pConfig->zName);
  if ((local_14 == 0) && (pConfig->bColumnsize != 0)) {
    local_14 = fts5ExecPrintf(pConfig->db,(char **)0x0,"DROP TABLE IF EXISTS %Q.\'%q_docsize\';",
                              pConfig->zDb,pConfig->zName);
  }
  if ((local_14 == 0) && (pConfig->eContent == 0)) {
    local_14 = fts5ExecPrintf(pConfig->db,(char **)0x0,"DROP TABLE IF EXISTS %Q.\'%q_content\';",
                              pConfig->zDb,pConfig->zName);
  }
  return local_14;
}

Assistant:

static int sqlite3Fts5DropAll(Fts5Config *pConfig){
  int rc = fts5ExecPrintf(pConfig->db, 0, 
      "DROP TABLE IF EXISTS %Q.'%q_data';"
      "DROP TABLE IF EXISTS %Q.'%q_idx';"
      "DROP TABLE IF EXISTS %Q.'%q_config';",
      pConfig->zDb, pConfig->zName,
      pConfig->zDb, pConfig->zName,
      pConfig->zDb, pConfig->zName
  );
  if( rc==SQLITE_OK && pConfig->bColumnsize ){
    rc = fts5ExecPrintf(pConfig->db, 0, 
        "DROP TABLE IF EXISTS %Q.'%q_docsize';",
        pConfig->zDb, pConfig->zName
    );
  }
  if( rc==SQLITE_OK && pConfig->eContent==FTS5_CONTENT_NORMAL ){
    rc = fts5ExecPrintf(pConfig->db, 0, 
        "DROP TABLE IF EXISTS %Q.'%q_content';",
        pConfig->zDb, pConfig->zName
    );
  }
  return rc;
}